

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemTable.cpp
# Opt level: O2

void __thiscall ItemTable::BlueRoomFive(ItemTable *this)

{
  ItemWrapper *this_00;
  ItemWrapper *this_01;
  ItemWrapper *this_02;
  mapped_type *ppIVar1;
  key_type local_104;
  string local_100;
  string local_e0;
  string local_c0;
  Item local_a0;
  Item local_78;
  Item local_50;
  
  this_00 = (ItemWrapper *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_c0,"Stone Tablet",(allocator *)&local_104);
  Item::Item(&local_50,&local_c0,TABLET);
  ItemWrapper::ItemWrapper(this_00,&local_50,B_ROOM5);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_c0);
  this_01 = (ItemWrapper *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_e0,"Stone ",(allocator *)&local_104);
  Item::Item(&local_78,&local_e0,STATUE);
  ItemWrapper::ItemWrapper(this_01,&local_78,B_ROOM5);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_e0);
  this_02 = (ItemWrapper *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_100,"Stone Box",(allocator *)&local_104);
  Item::Item(&local_a0,&local_100,BOX);
  ItemWrapper::ItemWrapper(this_02,&local_a0,HIDDEN);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_100);
  local_104 = TABLET;
  ppIVar1 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,&local_104);
  *ppIVar1 = this_00;
  local_104 = STATUE;
  ppIVar1 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,&local_104);
  *ppIVar1 = this_01;
  local_104 = BOX;
  ppIVar1 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,&local_104);
  *ppIVar1 = this_02;
  return;
}

Assistant:

void ItemTable::BlueRoomFive() {

    ItemWrapper * StoneTablet = new ItemWrapper(Item("Stone Tablet", TABLET), B_ROOM5);
    ItemWrapper * statue    = new ItemWrapper(Item("Stone ", STATUE), B_ROOM5);
    ItemWrapper * box       = new ItemWrapper(Item("Stone Box", BOX), HIDDEN);

    items[TABLET] = StoneTablet;
    items[STATUE] = statue;
    items[BOX]    = box;

}